

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,char16_t *value)

{
  char16_t *pcVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar2;
  basic_string_view<char16_t> value_00;
  char16_t *value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  
  if (value == (char16_t *)0x0) {
    fmt::v8::detail::throw_format_error("string pointer is null");
  }
  pcVar1 = (char16_t *)std::char_traits<char16_t>::length(value);
  value_00.size_ = (size_t)pcVar1;
  value_00.data_ = pcVar1;
  bVar2 = write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                    (out.container,(back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)value,
                     value_00);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR_CHAR_TRAITS auto write(OutputIt out, const Char* value)
    -> OutputIt {
  if (!value) {
    throw_format_error("string pointer is null");
  } else {
    out = write(out, basic_string_view<Char>(value));
  }
  return out;
}